

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O2

int Hsh_VecManHash(Vec_Int_t *vVec,int nTableSize)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  
  uVar4 = 0;
  puVar3 = Hsh_VecManHash::s_Primes;
  uVar2 = 0;
  while( true ) {
    if (vVec->nSize <= (int)uVar4) break;
    iVar1 = Vec_IntEntry(vVec,(int)uVar4);
    uVar2 = uVar2 + iVar1 * puVar3[(uVar4 / 7) * -7];
    uVar4 = uVar4 + 1;
    puVar3 = puVar3 + 1;
  }
  return uVar2 % (uint)nTableSize;
}

Assistant:

static inline int Hsh_VecManHash( Vec_Int_t * vVec, int nTableSize )
{
    static unsigned s_Primes[7] = {4177, 5147, 5647, 6343, 7103, 7873, 8147};
    unsigned Key = 0;
    int i, Entry;
    Vec_IntForEachEntry( vVec, Entry, i )
        Key += (unsigned)Entry * s_Primes[i % 7];
    return (int)(Key % nTableSize);
}